

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O2

bool __thiscall bloaty::ArgParser::TryParseOption(ArgParser *this,string_view flag,string_view *val)

{
  char cVar1;
  bool bVar2;
  string_view *psVar3;
  char *pcVar4;
  pointer pcVar5;
  Arg *in_R8;
  string_view sVar6;
  string_view expected;
  string_view format;
  allocator<char> local_99;
  string_view arg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string_view flag_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  
  pcVar4 = flag._M_str;
  pcVar5 = (pointer)flag._M_len;
  flag_local._M_len = (size_t)pcVar5;
  flag_local._M_str = pcVar4;
  if (pcVar5 < (pointer)0x2) {
    __assert_fail("flag.size() > 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/bloaty.cc",
                  0x80e,"bool bloaty::ArgParser::TryParseOption(string_view, string_view *)");
  }
  cVar1 = pcVar4[1];
  psVar3 = val;
  arg = Arg(this);
  bVar2 = TryParseFlag(this,flag);
  if (bVar2) {
    if (this->index_ == this->argc_) {
      format._M_str = (char *)&local_58;
      format._M_len = (size_t)"option \'$0\' requires an argument";
      local_58._M_dataplus._M_p = pcVar5;
      local_58._M_string_length = (size_type)pcVar4;
      absl::Substitute_abi_cxx11_(&local_88,(absl *)0x20,format,in_R8);
      Throw(local_88._M_dataplus._M_p,0x813);
    }
    sVar6 = ConsumeArg(this);
    *val = sVar6;
LAB_00180870:
    bVar2 = true;
  }
  else {
    if (cVar1 == '-') {
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)&local_88,&flag_local,&local_99);
      std::operator+(&local_58,&local_88,"=");
      expected._M_str = (char *)psVar3;
      expected._M_len = (size_t)local_58._M_dataplus._M_p;
      bVar2 = absl::ConsumePrefix((absl *)&arg,
                                  (Nonnull<absl::string_view_*>)local_58._M_string_length,expected);
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::~string((string *)&local_88);
      if (bVar2) {
        val->_M_len = arg._M_len;
        val->_M_str = arg._M_str;
        this->index_ = this->index_ + 1;
        goto LAB_00180870;
      }
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool TryParseOption(string_view flag, string_view* val) {
    assert(flag.size() > 1);
    bool is_long = flag[1] == '-';
    string_view arg = Arg();
    if (TryParseFlag(flag)) {
      if (IsDone()) {
        THROWF("option '$0' requires an argument", flag);
      }
      *val = ConsumeArg();
      return true;
    } else if (is_long && absl::ConsumePrefix(&arg, std::string(flag) + "=")) {
      *val = arg;
      index_++;
      return true;
    } else {
      return false;
    }
  }